

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluation_method.cpp
# Opt level: O3

void mpireorderinglib::MPIX_Dist_graph_internode_cost
               (MPI_Comm dist_graph_comm,int *total_offnode_neighbors,int *max_offnode_neighbors)

{
  undefined1 auVar1 [16];
  MPI_Group poVar2;
  void *pvVar3;
  void *pvVar4;
  long lVar5;
  int *piVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  long alStack_b0 [2];
  code *pcStack_a0;
  int aiStack_98 [4];
  undefined4 local_88;
  int status;
  int dist_graph_rank;
  int node_group_rank;
  int n_sources;
  int is_weighted;
  MPI_Comm node_comm;
  MPI_Group node_group;
  MPI_Group dist_graph_group;
  int *local_58;
  int *local_50;
  undefined1 *local_48;
  int local_40;
  uint local_3c;
  int node_group_size;
  int n_dest;
  int local_offnode_neighbors;
  int node_offnode_comm_size;
  long lVar13;
  
  pcStack_a0 = (code *)0x134875;
  MPI_Topo_test(dist_graph_comm,aiStack_98 + 3);
  if (aiStack_98[3] == 3) {
    *total_offnode_neighbors = 0;
    *max_offnode_neighbors = 0;
    pcStack_a0 = (code *)0x13489f;
    local_58 = total_offnode_neighbors;
    local_50 = max_offnode_neighbors;
    MPI_Comm_rank(dist_graph_comm,&local_88);
    pcStack_a0 = (code *)0x1348ba;
    MPI_Comm_split_type(dist_graph_comm,0,local_88,&ompi_mpi_info_null,&n_sources);
    pcStack_a0 = (code *)0x1348c9;
    MPI_Comm_group(_n_sources,&node_comm);
    pcStack_a0 = (code *)0x1348d8;
    MPI_Group_size(node_comm,&local_40);
    pcStack_a0 = (code *)0x1348e4;
    MPI_Group_rank(node_comm,&status);
    uVar7 = 0xffffffffffffffff;
    if (-1 < (long)local_40) {
      uVar7 = (long)local_40 * 4;
    }
    pcStack_a0 = (code *)0x134905;
    pvVar3 = operator_new__(uVar7);
    pcStack_a0 = (code *)0x134910;
    pvVar4 = operator_new__(uVar7);
    pcStack_a0 = (code *)0x13491f;
    MPI_Comm_group(dist_graph_comm,&node_group);
    auVar1 = _DAT_00155010;
    lVar9 = (long)local_40;
    if (0 < lVar9) {
      lVar13 = lVar9 + -1;
      auVar11._8_4_ = (int)lVar13;
      auVar11._0_8_ = lVar13;
      auVar11._12_4_ = (int)((ulong)lVar13 >> 0x20);
      uVar7 = 0;
      auVar11 = auVar11 ^ _DAT_00155010;
      auVar12 = _DAT_00155000;
      do {
        auVar14 = auVar12 ^ auVar1;
        if ((bool)(~(auVar14._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar14._0_4_ ||
                    auVar11._4_4_ < auVar14._4_4_) & 1)) {
          *(int *)((long)pvVar3 + uVar7 * 4) = (int)uVar7;
        }
        if ((auVar14._12_4_ != auVar11._12_4_ || auVar14._8_4_ <= auVar11._8_4_) &&
            auVar14._12_4_ <= auVar11._12_4_) {
          *(int *)((long)pvVar3 + uVar7 * 4 + 4) = (int)uVar7 + 1;
        }
        uVar7 = uVar7 + 2;
        lVar13 = auVar12._8_8_;
        auVar12._0_8_ = auVar12._0_8_ + 2;
        auVar12._8_8_ = lVar13 + 2;
      } while ((local_40 + 1U & 0xfffffffe) != uVar7);
    }
    pcStack_a0 = (code *)0x1349cc;
    MPI_Group_translate_ranks(node_comm,lVar9,pvVar3,node_group,pvVar4);
    pcStack_a0 = (code *)0x1349e6;
    MPI_Dist_graph_neighbors_count(dist_graph_comm,&dist_graph_rank,&local_3c,&node_group_rank);
    uVar7 = (ulong)local_3c * 4 + 0xf & 0xfffffffffffffff0;
    lVar9 = (-0x98 - ((ulong)(uint)dist_graph_rank * 4 + 0xf & 0xfffffffffffffff0)) - uVar7;
    lVar13 = (long)aiStack_98 +
             ((lVar9 - ((ulong)(uint)dist_graph_rank * 4 + 0xf & 0xfffffffffffffff0)) - uVar7) +
             0x98;
    dist_graph_group = (MPI_Group)dist_graph_comm;
    local_48 = (undefined1 *)aiStack_98;
    *(long *)(lVar13 + -0x10) = lVar13;
    *(undefined8 *)(lVar13 + -0x18) = 0x134a50;
    MPI_Dist_graph_neighbors(dist_graph_comm);
    node_group_size = 0;
    if (0 < (int)local_3c) {
      iVar8 = 0;
      lVar10 = 0;
      do {
        n_dest = *(int *)((long)aiStack_98 + lVar10 * 4 + lVar9 + 0x98);
        if (n_dest != -2) {
          lVar5 = (long)local_40;
          *(undefined8 *)(lVar13 + -8) = 0x134a90;
          piVar6 = std::__find_if<int*,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                             (pvVar4,(void *)(lVar5 * 4 + (long)pvVar4),&n_dest);
          if (piVar6 == (int *)((long)local_40 * 4 + (long)pvVar4)) {
            iVar8 = iVar8 + 1;
            node_group_size = iVar8;
          }
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < (int)local_3c);
    }
    *(undefined8 *)(lVar13 + -8) = 0x134ae2;
    MPI_Allreduce(&node_group_size,&n_dest,1,&ompi_mpi_int,&ompi_mpi_op_sum,_n_sources);
    piVar6 = local_50;
    poVar2 = dist_graph_group;
    *(undefined8 *)(lVar13 + -8) = 0x134b04;
    MPI_Allreduce(&n_dest,piVar6,1,&ompi_mpi_int,&ompi_mpi_op_max,poVar2);
    piVar6 = local_58;
    *(undefined8 *)(lVar13 + -8) = 0x134b22;
    MPI_Allreduce(&node_group_size,piVar6,1,&ompi_mpi_int,&ompi_mpi_op_sum,poVar2);
    *(undefined8 *)(lVar13 + -8) = 0x134b2a;
    operator_delete__(pvVar3);
    *(undefined8 *)(lVar13 + -8) = 0x134b32;
    operator_delete__(pvVar4);
    return;
  }
  pcStack_a0 = MPIX_Dist_graph_create_from_cart_comm;
  __assert_fail("status == MPI_DIST_GRAPH",
                "/workspace/llm4binary/github/license_all_cmakelists_25/viennamapping[P]mpicartreorderlib/src/Evaluation/evaluation_method.cpp"
                ,0x4d,
                "void mpireorderinglib::MPIX_Dist_graph_internode_cost(MPI_Comm, int *, int *)");
}

Assistant:

void mpireorderinglib::MPIX_Dist_graph_internode_cost(MPI_Comm dist_graph_comm,
													  int *total_offnode_neighbors,
													  int *max_offnode_neighbors) {
  int status;
  MPI_Topo_test(dist_graph_comm, &status);
  assert(status == MPI_DIST_GRAPH);
  CARTREORDER_INFO("Value written in total before " + std::to_string(*total_offnode_neighbors));
  CARTREORDER_INFO("Value written in max before " + std::to_string(*max_offnode_neighbors));
  *total_offnode_neighbors = 0;
  *max_offnode_neighbors = 0;

  //find out which processes are on the same node
  MPI_Comm node_comm;
  MPI_Group node_group;
  MPI_Group dist_graph_group;

  int dist_graph_rank;
  MPI_Comm_rank(dist_graph_comm, &dist_graph_rank);

  MPI_Comm_split_type(dist_graph_comm, MPI_COMM_TYPE_SHARED,
					  dist_graph_rank, MPI_INFO_NULL, &node_comm);

  int node_group_size, node_group_rank;

  //extract the corresponding groups
  MPI_Comm_group(node_comm, &node_group);
  MPI_Group_size(node_group, &node_group_size);
  MPI_Group_rank(node_group, &node_group_rank);

  int *const group_ranks = new int[node_group_size];
  int *const dist_graph_comm_ranks = new int[node_group_size];

  MPI_Comm_group(dist_graph_comm, &dist_graph_group);

  //initialize node group ranks array
  for (int i{0}; i < node_group_size; i++) {
	group_ranks[i] = i;
  }

  //translate the ranks in the group to the ranks
  //in the old communicator dist_graph_comm
  MPI_Group_translate_ranks(node_group, node_group_size,
							group_ranks, dist_graph_group, dist_graph_comm_ranks);

  int n_sources, n_dest, is_weighted;
  MPI_Dist_graph_neighbors_count(dist_graph_comm, &n_sources,
								 &n_dest, &is_weighted);

  //Each process only counts the communication he starts
  //Good idea to do so?
  int sources[n_sources];
  int dest[n_dest];
  int source_weights[n_sources];
  int dest_weights[n_dest];

  MPI_Dist_graph_neighbors(dist_graph_comm, n_sources, sources,
						   source_weights, n_dest, dest, dest_weights);

  //Explicitly reset the neighbor count and start from
  //zero. Anotherwise one would count MPI_PROC_NULL.
  //Start locally und communicate globally.
  int local_offnode_neighbors = 0;
  int *index_of_neighbor;

  // Another assumption was made, that the number on each
  // process is small. Meaning we have
  // O(num_oncore_pe*neighbors) operations. No presorting
  // of neighbors is done.
  // Only the destination targets are counted
  for (int i{0}; i < n_dest; i++) {
	int neighbor = dest[i];
	if (neighbor == MPI_PROC_NULL)
	  continue;

	index_of_neighbor = std::find(dist_graph_comm_ranks,
								  dist_graph_comm_ranks + node_group_size,
								  neighbor);

	//Increase offnode neighbor count if no index
	//was found
	if (index_of_neighbor == dist_graph_comm_ranks + node_group_size) {
	  local_offnode_neighbors += 1;
	}
  }

  CARTREORDER_INFO("Rank " + std::to_string(dist_graph_rank) + " has " + std::to_string(local_offnode_neighbors) + " off node neighbors");

  int node_offnode_comm_size;
  MPI_Allreduce(&local_offnode_neighbors,
				&node_offnode_comm_size,
				1, MPI_INT, MPI_SUM, node_comm);

  //Communicate max offnode neighbors
  MPI_Allreduce(&node_offnode_comm_size,
				max_offnode_neighbors,
				1, MPI_INT, MPI_MAX, dist_graph_comm);

  //Communciate local offnode neighbors to everybody
  //sum up and devide by two. Symmetry assumption
  MPI_Allreduce(&local_offnode_neighbors,
				total_offnode_neighbors,
				1, MPI_INT, MPI_SUM, dist_graph_comm);

  delete[] group_ranks;
  delete[] dist_graph_comm_ranks;
}